

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

bool __thiscall
SQCompilation::CheckerVisitor::isPotentiallyNullable
          (CheckerVisitor *this,Expr *e,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited)

{
  TreeOp TVar1;
  int iVar2;
  ValueRefState VVar3;
  _func_int **pp_Var4;
  SQChar *n;
  bool bVar5;
  iterator iVar6;
  ValueRef *pVVar7;
  Expr *pEVar8;
  long lVar9;
  LiteralExpr *l;
  Expr *local_30;
  int32_t local_24;
  
  for (; e != (Expr *)0x0; e = (Expr *)e[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
    if ((e->super_Node)._op != TO_PAREN) goto LAB_00156d3d;
  }
  e = (Expr *)0x0;
LAB_00156d3d:
  local_30 = e;
  iVar6 = std::
          _Hashtable<const_SQCompilation::Expr_*,_const_SQCompilation::Expr_*,_std::allocator<const_SQCompilation::Expr_*>,_std::__detail::_Identity,_std::equal_to<const_SQCompilation::Expr_*>,_std::hash<const_SQCompilation::Expr_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&visited->_M_h,&local_30);
  if (iVar6.super__Node_iterator_base<const_SQCompilation::Expr_*,_false>._M_cur !=
      (__node_type *)0x0) {
    return false;
  }
  std::
  _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<SQCompilation::Expr_const*&>
            ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_30);
  pVVar7 = findValueForExpr(this,local_30);
  if (pVVar7 != (ValueRef *)0x0) {
    if ((pVVar7->flagsPositive & 2) != 0) {
      return true;
    }
    if ((pVVar7->flagsNegative & 2) != 0) {
      return false;
    }
    if (pVVar7->state == VRS_UNDEFINED) {
      return true;
    }
    if (pVVar7->state == VRS_PARTIALLY) {
      return true;
    }
  }
  pEVar8 = maybeEval(this,local_30,&local_24,false);
  TVar1 = (pEVar8->super_Node)._op;
  if (TVar1 == TO_LITERAL) {
    return *(int *)&(pEVar8->super_Node).field_0x1c == 4;
  }
  local_30 = pEVar8;
  if (TVar1 - TO_GETFIELD < 4) {
    if ((char)pEVar8[1].super_Node._coordinates.lineStart != '\0') {
      return true;
    }
    goto LAB_00156e5c;
  }
  if (TVar1 == TO_NULLC) {
    pEVar8 = *(Expr **)&pEVar8[1].super_Node._coordinates;
    goto LAB_00156e98;
  }
  if (TVar1 == TO_TERNARY) {
    bVar5 = isPotentiallyNullable(this,*(Expr **)&pEVar8[1].super_Node._coordinates,visited);
    if (bVar5) {
      return true;
    }
    pEVar8 = *(Expr **)&pEVar8[1].super_Node._coordinates.lineEnd;
    goto LAB_00156e98;
  }
  if (TVar1 == TO_CALL) {
    if (*(char *)&pEVar8[2].super_Node.super_ArenaObj._vptr_ArenaObj != '\0') {
      return true;
    }
    pp_Var4 = pEVar8[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    iVar2 = *(int *)(pp_Var4 + 3);
    if (iVar2 == 0x11) {
      lVar9 = 0x20;
    }
    else {
      if (iVar2 != 0x3f) goto LAB_00156e5c;
      lVar9 = 0x30;
    }
    n = *(SQChar **)((long)pp_Var4 + lVar9);
    if ((n != (SQChar *)0x0) && (bVar5 = canFunctionReturnNull(n), bVar5)) {
      return true;
    }
  }
LAB_00156e5c:
  pVVar7 = findValueForExpr(this,pEVar8);
  if (pVVar7 != (ValueRef *)0x0) {
    VVar3 = pVVar7->state;
    if (VVar3 - VRS_EXPRESSION < 2) {
      pEVar8 = pVVar7->expression;
LAB_00156e98:
      bVar5 = isPotentiallyNullable(this,pEVar8,visited);
      return bVar5;
    }
    if (VVar3 == VRS_UNDEFINED) {
      return true;
    }
    if (VVar3 == VRS_PARTIALLY) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CheckerVisitor::isPotentiallyNullable(const Expr *e, std::unordered_set<const Expr *> &visited) {

  e = deparen(e);

  auto existed = visited.find(e);
  if (existed != visited.end()) {
    return false;
  }

  visited.emplace(e);

  const ValueRef *v = findValueForExpr(e);

  if (v) {
    if (v->flagsPositive & RT_NULL)
      return true;

    if (v->flagsNegative & RT_NULL)
      return false;

    if (v->state == VRS_UNDEFINED || v->state == VRS_PARTIALLY)
      return true;
  }

  e = maybeEval(e);

  if (e->op() == TO_LITERAL) {
    const LiteralExpr *l = e->asLiteral();
    return l->kind() == LK_NULL;
  }

  if (e->isAccessExpr()) {
    if (e->asAccessExpr()->isNullable()) {
      return true;
    }
  }

  if (e->op() == TO_CALL) {
    const CallExpr *call = static_cast<const CallExpr *>(e);
    if (call->isNullable()) {
      return true;
    }

    const SQChar *funcName = nullptr;
    const Expr *callee = call->callee();

    if (callee->op() == TO_ID) {
      funcName = callee->asId()->id();
    }
    else if (callee->op() == TO_GETFIELD) {
      funcName = callee->asGetField()->fieldName();
    }

    if (funcName) {
      if (canFunctionReturnNull(funcName)) {
        return true;
      }
    }
  }

  if (e->op() == TO_NULLC) {
    return isPotentiallyNullable(static_cast<const BinExpr *>(e)->rhs(), visited);
  }

  if (e->op() == TO_TERNARY) {
    const TerExpr *t = static_cast<const TerExpr *>(e);
    return isPotentiallyNullable(t->b(), visited) || isPotentiallyNullable(t->c(), visited);
  }

  v = findValueForExpr(e);

  if (v) {
    switch (v->state)
    {
    case VRS_EXPRESSION:
    case VRS_INITIALIZED:
      return isPotentiallyNullable(v->expression, visited);
    case VRS_UNDEFINED:
    case VRS_PARTIALLY:
      return true;
    default:
      return false;
    }
  }

  return false;
}